

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetObjectFileNameWithoutTarget
          (string *__return_storage_ptr__,cmLocalGenerator *this,cmSourceFile *source,
          string *dir_max,bool *hasSourceExtension,char *customOutputExtension)

{
  cmMakefile *this_00;
  bool bVar1;
  string *psVar2;
  string *psVar3;
  string *psVar4;
  cmValue cVar5;
  cmValue cVar6;
  long lVar7;
  bool bVar8;
  pointer local_1e8;
  string objectName;
  string relFromBinary;
  string relFromSource;
  string lang;
  RegularExpression var;
  string local_80;
  cmAlphaNum local_60;
  
  psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  psVar3 = GetSourceDirectory_abi_cxx11_(this);
  psVar4 = GetCurrentSourceDirectory_abi_cxx11_(this);
  anon_unknown.dwarf_eecef::relativeIfUnder(&relFromSource,psVar3,psVar4,psVar2);
  if (relFromSource._M_string_length == 0) {
    __assert_fail("!relFromSource.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xec4,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&relFromSource);
  psVar3 = GetBinaryDirectory_abi_cxx11_(this);
  psVar4 = GetCurrentBinaryDirectory_abi_cxx11_(this);
  anon_unknown.dwarf_eecef::relativeIfUnder(&relFromBinary,psVar3,psVar4,psVar2);
  if (relFromBinary._M_string_length == 0) {
    __assert_fail("!relFromBinary.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLocalGenerator.cxx"
                  ,0xecb,
                  "std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(const cmSourceFile &, const std::string &, bool *, const char *)"
                 );
  }
  cmsys::SystemTools::FileIsFullPath(&relFromBinary);
  objectName._M_dataplus._M_p = (pointer)&objectName.field_2;
  objectName._M_string_length = 0;
  objectName.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&objectName);
  bVar1 = cmsys::SystemTools::FileIsFullPath(&objectName);
  if ((bVar1) && (bVar1 = cmake::GetIsInTryCompile(this->GlobalGenerator->CMakeInstance), bVar1)) {
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(source);
    cmsys::SystemTools::GetFilenameName((string *)&var,psVar2);
    std::__cxx11::string::operator=((string *)&objectName,(string *)&var);
    std::__cxx11::string::~string((string *)&var);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&var,"UNITY_SOURCE_FILE",(allocator<char> *)&local_60);
  cVar5 = cmSourceFile::GetProperty(source,(string *)&var);
  std::__cxx11::string::~string((string *)&var);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&var,"PCH_EXTENSION",(allocator<char> *)&local_60);
  cVar6 = cmSourceFile::GetProperty(source,(string *)&var);
  std::__cxx11::string::~string((string *)&var);
  lVar7 = std::__cxx11::string::find((char *)&objectName,0x5c713a);
  local_1e8 = customOutputExtension;
  if (((cVar5.Value != (string *)0x0) || (cVar6.Value != (string *)0x0)) || (lVar7 != -1)) {
    if (cVar6.Value != (string *)0x0) {
      local_1e8 = ((cVar6.Value)->_M_dataplus)._M_p;
    }
    cmsys::RegularExpression::RegularExpression(&var,"(CMakeFiles/[^/]+.dir/)");
    bVar1 = cmsys::RegularExpression::find(&var,objectName._M_dataplus._M_p);
    if (bVar1) {
      std::__cxx11::string::erase
                ((ulong)&objectName,(long)var.regmatch.startp[0] - (long)var.regmatch.searchstring);
    }
    cmsys::RegularExpression::~RegularExpression(&var);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&var,"KEEP_EXTENSION",(allocator<char> *)&local_60);
  bVar1 = cmSourceFile::GetPropertyAsBool(source,(string *)&var);
  std::__cxx11::string::~string((string *)&var);
  bVar8 = true;
  if (bVar1) goto LAB_00175e1f;
  bVar1 = NeedBackwardsCompatibility_2_4(this);
  if (bVar1) {
LAB_00175ca4:
    lVar7 = std::__cxx11::string::rfind((char)&objectName,0x2e);
    if (lVar7 != -1) {
      std::__cxx11::string::substr((ulong)&var,(ulong)&objectName);
      std::__cxx11::string::operator=((string *)&objectName,(string *)&var);
      std::__cxx11::string::~string((string *)&var);
    }
    if (local_1e8 != (pointer)0x0) {
      std::__cxx11::string::append((char *)&objectName);
      bVar8 = false;
      goto LAB_00175e1f;
    }
    bVar8 = false;
  }
  else {
    cmSourceFile::GetLanguage_abi_cxx11_(&lang,source);
    if (lang._M_string_length == 0) {
      bVar1 = false;
    }
    else {
      this_00 = this->Makefile;
      var.regmatch.startp[0] = &DAT_00000006;
      var.regmatch.startp[1] = "CMAKE_";
      local_60.View_._M_len = lang._M_string_length;
      local_60.View_._M_str = lang._M_dataplus._M_p;
      cmStrCat<char[26]>(&local_80,(cmAlphaNum *)&var,&local_60,
                         (char (*) [26])"_OUTPUT_EXTENSION_REPLACE");
      bVar1 = cmMakefile::IsOn(this_00,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    std::__cxx11::string::~string((string *)&lang);
    if ((local_1e8 != (pointer)0x0) || (bVar8 = true, bVar1 != false)) goto LAB_00175ca4;
  }
  cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
            ((string *)&var,this->GlobalGenerator,source);
  std::__cxx11::string::append((string *)&objectName);
  std::__cxx11::string::~string((string *)&var);
LAB_00175e1f:
  if (hasSourceExtension != (bool *)0x0) {
    *hasSourceExtension = bVar8;
  }
  psVar2 = CreateSafeUniqueObjectFileName(this,&objectName,dir_max);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::~string((string *)&objectName);
  std::__cxx11::string::~string((string *)&relFromBinary);
  std::__cxx11::string::~string((string *)&relFromSource);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetObjectFileNameWithoutTarget(
  const cmSourceFile& source, std::string const& dir_max,
  bool* hasSourceExtension, char const* customOutputExtension)
{
  // Construct the object file name using the full path to the source
  // file which is its only unique identification.
  std::string const& fullPath = source.GetFullPath();

  // Try referencing the source relative to the source tree.
  std::string relFromSource = relativeIfUnder(
    this->GetSourceDirectory(), this->GetCurrentSourceDirectory(), fullPath);
  assert(!relFromSource.empty());
  bool relSource = !cmSystemTools::FileIsFullPath(relFromSource);
  bool subSource = relSource && relFromSource[0] != '.';

  // Try referencing the source relative to the binary tree.
  std::string relFromBinary = relativeIfUnder(
    this->GetBinaryDirectory(), this->GetCurrentBinaryDirectory(), fullPath);
  assert(!relFromBinary.empty());
  bool relBinary = !cmSystemTools::FileIsFullPath(relFromBinary);
  bool subBinary = relBinary && relFromBinary[0] != '.';

  // Select a nice-looking reference to the source file to construct
  // the object file name.
  std::string objectName;
  // XXX(clang-tidy): https://bugs.llvm.org/show_bug.cgi?id=44165
  // NOLINTNEXTLINE(bugprone-branch-clone)
  if ((relSource && !relBinary) || (subSource && !subBinary)) {
    objectName = relFromSource;
  } else if ((relBinary && !relSource) || (subBinary && !subSource) ||
             relFromBinary.length() < relFromSource.length()) {
    objectName = relFromBinary;
  } else {
    objectName = relFromSource;
  }

  // if it is still a full path check for the try compile case
  // try compile never have in source sources, and should not
  // have conflicting source file names in the same target
  if (cmSystemTools::FileIsFullPath(objectName)) {
    if (this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
      objectName = cmSystemTools::GetFilenameName(source.GetFullPath());
    }
  }

  // Ensure that for the CMakeFiles/<target>.dir/generated_source_file
  // we don't end up having:
  // CMakeFiles/<target>.dir/CMakeFiles/<target>.dir/generated_source_file.obj
  cmValue unitySourceFile = source.GetProperty("UNITY_SOURCE_FILE");
  cmValue pchExtension = source.GetProperty("PCH_EXTENSION");
  const bool isPchObject = objectName.find("cmake_pch") != std::string::npos;
  if (unitySourceFile || pchExtension || isPchObject) {
    if (pchExtension) {
      customOutputExtension = pchExtension->c_str();
    }

    cmsys::RegularExpression var("(CMakeFiles/[^/]+.dir/)");
    if (var.find(objectName)) {
      objectName.erase(var.start(), var.end() - var.start());
    }
  }

  // Replace the original source file extension with the object file
  // extension.
  bool keptSourceExtension = true;
  if (!source.GetPropertyAsBool("KEEP_EXTENSION")) {
    // Decide whether this language wants to replace the source
    // extension with the object extension.  For CMake 2.4
    // compatibility do this by default.
    bool replaceExt = this->NeedBackwardsCompatibility_2_4();
    if (!replaceExt) {
      std::string lang = source.GetLanguage();
      if (!lang.empty()) {
        replaceExt = this->Makefile->IsOn(
          cmStrCat("CMAKE_", lang, "_OUTPUT_EXTENSION_REPLACE"));
      }
    }

    // Remove the source extension if it is to be replaced.
    if (replaceExt || customOutputExtension) {
      keptSourceExtension = false;
      std::string::size_type dot_pos = objectName.rfind('.');
      if (dot_pos != std::string::npos) {
        objectName = objectName.substr(0, dot_pos);
      }
    }

    // Store the new extension.
    if (customOutputExtension) {
      objectName += customOutputExtension;
    } else {
      objectName += this->GlobalGenerator->GetLanguageOutputExtension(source);
    }
  }
  if (hasSourceExtension) {
    *hasSourceExtension = keptSourceExtension;
  }

  // Convert to a safe name.
  return this->CreateSafeUniqueObjectFileName(objectName, dir_max);
}